

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Entity_State_PDU::ResetDeadReckoning(Entity_State_PDU *this)

{
  DeadReckoningParameter *this_00;
  DeadReckoningCalculator *this_01;
  DeadReckoningAlgorithm DRA;
  Vector *LinearAcceleration;
  Vector *AngularVelocity;
  Vector VStack_48;
  
  this_01 = this->m_pDrCalc;
  if (this_01 != (DeadReckoningCalculator *)0x0) {
    this_00 = &this->m_DeadReckoningParameter;
    LinearAcceleration = DATA_TYPE::DeadReckoningParameter::GetLinearAcceleration(this_00);
    AngularVelocity = DATA_TYPE::DeadReckoningParameter::GetAngularVelocity(this_00);
    DATA_TYPE::DeadReckoningParameter::GetQuatAxis(&VStack_48,this_00);
    DRA = DATA_TYPE::DeadReckoningParameter::GetDeadReckoningAlgorithm(this_00);
    UTILS::DeadReckoningCalculator::Reset
              (this_01,&this->m_EntityLinearVelocity,LinearAcceleration,AngularVelocity,
               &this->m_EntityLocation,&this->m_EntityOrientation,&VStack_48,DRA);
    DATA_TYPE::DataTypeBase::~DataTypeBase(&VStack_48.super_DataTypeBase);
  }
  return;
}

Assistant:

void Entity_State_PDU::ResetDeadReckoning()
{
    if( m_pDrCalc )
    {
        m_pDrCalc->Reset( m_EntityLinearVelocity, m_DeadReckoningParameter.GetLinearAcceleration(), m_DeadReckoningParameter.GetAngularVelocity(),
                          m_EntityLocation, m_EntityOrientation, m_DeadReckoningParameter.GetQuatAxis(), m_DeadReckoningParameter.GetDeadReckoningAlgorithm() );
    }
}